

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUSettings.cpp
# Opt level: O0

bool __thiscall
RTIMUSettings::discoverIMU(RTIMUSettings *this,int *imuType,bool *busIsI2C,uchar *slaveAddress)

{
  bool bVar1;
  uchar local_32;
  uchar local_31;
  uchar altResult;
  uchar *puStack_30;
  uchar result;
  uchar *slaveAddress_local;
  bool *busIsI2C_local;
  int *imuType_local;
  RTIMUSettings *this_local;
  
  (this->super_RTIMUHal).m_busIsI2C = true;
  puStack_30 = slaveAddress;
  slaveAddress_local = busIsI2C;
  busIsI2C_local = (bool *)imuType;
  imuType_local = (int *)this;
  bVar1 = RTIMUHal::HALOpen(&this->super_RTIMUHal);
  if (bVar1) {
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'h','u','\x01',&local_31,"");
    if (bVar1) {
      if (local_31 == 'q') {
        busIsI2C_local[0] = true;
        busIsI2C_local[1] = false;
        busIsI2C_local[2] = false;
        busIsI2C_local[3] = false;
        *puStack_30 = 'h';
        *slaveAddress_local = '\x01';
        printf("%s","Detected MPU9250 at standard address\n");
        fflush(_stdout);
        return true;
      }
      if (local_31 == 'h') {
        busIsI2C_local[0] = true;
        busIsI2C_local[1] = false;
        busIsI2C_local[2] = false;
        busIsI2C_local[3] = false;
        *puStack_30 = 'h';
        *slaveAddress_local = '\x01';
        printf("%s","Detected MPU9150 at standard address\n");
        fflush(_stdout);
        return true;
      }
    }
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'i','u','\x01',&local_31,"");
    if (bVar1) {
      if (local_31 == 'q') {
        busIsI2C_local[0] = true;
        busIsI2C_local[1] = false;
        busIsI2C_local[2] = false;
        busIsI2C_local[3] = false;
        *puStack_30 = 'i';
        *slaveAddress_local = '\x01';
        printf("%s","Detected MPU9250 at option address\n");
        fflush(_stdout);
        return true;
      }
      if (local_31 == 'h') {
        busIsI2C_local[0] = true;
        busIsI2C_local[1] = false;
        busIsI2C_local[2] = false;
        busIsI2C_local[3] = false;
        *puStack_30 = 'i';
        *slaveAddress_local = '\x01';
        printf("%s","Detected MPU9150 at option address\n");
        fflush(_stdout);
        return true;
      }
    }
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'j','\x0f','\x01',&local_31,"");
    if (bVar1) {
      if (local_31 == 0xd7) {
        bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\x1e','\x0f','\x01',&local_32,"");
        if ((bVar1) && (local_32 == 'I')) {
          busIsI2C_local[0] = true;
          busIsI2C_local[1] = false;
          busIsI2C_local[2] = false;
          busIsI2C_local[3] = false;
          *puStack_30 = 'j';
          *slaveAddress_local = '\x01';
          printf("%s","Detected L3GD20H/LSM303D at standard/standard address\n");
          fflush(_stdout);
          return true;
        }
        bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\x1d','\x0f','\x01',&local_32,"");
        if ((bVar1) && (local_32 == 'I')) {
          busIsI2C_local[0] = true;
          busIsI2C_local[1] = false;
          busIsI2C_local[2] = false;
          busIsI2C_local[3] = false;
          *puStack_30 = 'j';
          *slaveAddress_local = '\x01';
          printf("%s","Detected L3GD20H/LSM303D at standard/option address\n");
          fflush(_stdout);
          return true;
        }
        bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\x19','\'','\x01',&local_32,"");
        if (bVar1) {
          busIsI2C_local[0] = true;
          busIsI2C_local[1] = false;
          busIsI2C_local[2] = false;
          busIsI2C_local[3] = false;
          *puStack_30 = 'j';
          *slaveAddress_local = '\x01';
          printf("%s","Detected L3GD20H/LSM303DLHC at standard/standard address\n");
          fflush(_stdout);
          return true;
        }
      }
      else if (local_31 == 0xd4) {
        bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\x1e','\x0f','\x01',&local_32,"");
        if ((bVar1) && (local_32 == 'I')) {
          busIsI2C_local[0] = true;
          busIsI2C_local[1] = false;
          busIsI2C_local[2] = false;
          busIsI2C_local[3] = false;
          *puStack_30 = 'j';
          *slaveAddress_local = '\x01';
          printf("%s","Detected LSM9DS0 at standard/standard address\n");
          fflush(_stdout);
          return true;
        }
        bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\x1d','\x0f','\x01',&local_32,"");
        if ((bVar1) && (local_32 == 'I')) {
          busIsI2C_local[0] = true;
          busIsI2C_local[1] = false;
          busIsI2C_local[2] = false;
          busIsI2C_local[3] = false;
          *puStack_30 = 'j';
          *slaveAddress_local = '\x01';
          printf("%s","Detected LSM9DS0 at standard/option address\n");
          fflush(_stdout);
          return true;
        }
      }
      else if (local_31 == 'h') {
        bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\x1c','\x0f','\x01',&local_32,"");
        if ((bVar1) && (local_32 == '=')) {
          busIsI2C_local[0] = true;
          busIsI2C_local[1] = false;
          busIsI2C_local[2] = false;
          busIsI2C_local[3] = false;
          *puStack_30 = 'j';
          *slaveAddress_local = '\x01';
          printf("%s","Detected LSM9DS1 at standard/standard address\n");
          fflush(_stdout);
          return true;
        }
        bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\x1d','\x0f','\x01',&local_32,"");
        if ((bVar1) && (local_32 == '=')) {
          busIsI2C_local[0] = true;
          busIsI2C_local[1] = false;
          busIsI2C_local[2] = false;
          busIsI2C_local[3] = false;
          *puStack_30 = 'j';
          *slaveAddress_local = '\x01';
          printf("%s","Detected LSM9DS1 at standard/option 1 address\n");
          fflush(_stdout);
          return true;
        }
        bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\x1e','\x0f','\x01',&local_32,"");
        if ((bVar1) && (local_32 == '=')) {
          busIsI2C_local[0] = true;
          busIsI2C_local[1] = false;
          busIsI2C_local[2] = false;
          busIsI2C_local[3] = false;
          *puStack_30 = 'j';
          *slaveAddress_local = '\x01';
          printf("%s","Detected LSM9DS1 at standard/option 2 address\n");
          fflush(_stdout);
          return true;
        }
        bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\x1f','\x0f','\x01',&local_32,"");
        if ((bVar1) && (local_32 == '=')) {
          busIsI2C_local[0] = true;
          busIsI2C_local[1] = false;
          busIsI2C_local[2] = false;
          busIsI2C_local[3] = false;
          *puStack_30 = 'j';
          *slaveAddress_local = '\x01';
          printf("%s","Detected LSM9DS1 at standard/option 3 address\n");
          fflush(_stdout);
          return true;
        }
      }
    }
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'k','\x0f','\x01',&local_31,"");
    if (bVar1) {
      if (local_31 == 0xd7) {
        bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\x1d','\x0f','\x01',&local_32,"");
        if ((bVar1) && (local_32 == 'I')) {
          busIsI2C_local[0] = true;
          busIsI2C_local[1] = false;
          busIsI2C_local[2] = false;
          busIsI2C_local[3] = false;
          *puStack_30 = 'k';
          *slaveAddress_local = '\x01';
          printf("%s","Detected L3GD20H/LSM303D at option/option address\n");
          fflush(_stdout);
          return true;
        }
        bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\x1e','\x0f','\x01',&local_32,"");
        if ((bVar1) && (local_32 == 'I')) {
          busIsI2C_local[0] = true;
          busIsI2C_local[1] = false;
          busIsI2C_local[2] = false;
          busIsI2C_local[3] = false;
          *puStack_30 = 'k';
          *slaveAddress_local = '\x01';
          printf("%s","Detected L3GD20H/LSM303D at option/standard address\n");
          fflush(_stdout);
          return true;
        }
        bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\x19','\'','\x01',&local_32,"");
        if (bVar1) {
          busIsI2C_local[0] = true;
          busIsI2C_local[1] = false;
          busIsI2C_local[2] = false;
          busIsI2C_local[3] = false;
          *puStack_30 = 'k';
          *slaveAddress_local = '\x01';
          printf("%s","Detected L3GD20H/LSM303DLHC at option/standard address\n");
          fflush(_stdout);
          return true;
        }
      }
      else if (local_31 == 0xd4) {
        bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\x1d','\x0f','\x01',&local_32,"");
        if ((bVar1) && (local_32 == 'I')) {
          busIsI2C_local[0] = true;
          busIsI2C_local[1] = false;
          busIsI2C_local[2] = false;
          busIsI2C_local[3] = false;
          *puStack_30 = 'k';
          *slaveAddress_local = '\x01';
          printf("%s","Detected LSM9DS0 at option/option address\n");
          fflush(_stdout);
          return true;
        }
        bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\x1e','\x0f','\x01',&local_32,"");
        if ((bVar1) && (local_32 == 'I')) {
          busIsI2C_local[0] = true;
          busIsI2C_local[1] = false;
          busIsI2C_local[2] = false;
          busIsI2C_local[3] = false;
          *puStack_30 = 'k';
          *slaveAddress_local = '\x01';
          printf("%s","Detected LSM9DS0 at option/standard address\n");
          fflush(_stdout);
          return true;
        }
      }
      else if (local_31 == 'h') {
        bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\x1c','\x0f','\x01',&local_32,"");
        if ((bVar1) && (local_32 == '=')) {
          busIsI2C_local[0] = true;
          busIsI2C_local[1] = false;
          busIsI2C_local[2] = false;
          busIsI2C_local[3] = false;
          *puStack_30 = 'k';
          *slaveAddress_local = '\x01';
          printf("%s","Detected LSM9DS1 at option/standard address\n");
          fflush(_stdout);
          return true;
        }
        bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\x1d','\x0f','\x01',&local_32,"");
        if ((bVar1) && (local_32 == '=')) {
          busIsI2C_local[0] = true;
          busIsI2C_local[1] = false;
          busIsI2C_local[2] = false;
          busIsI2C_local[3] = false;
          *puStack_30 = 'k';
          *slaveAddress_local = '\x01';
          printf("%s","Detected LSM9DS1 at option/option 1 address\n");
          fflush(_stdout);
          return true;
        }
        bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\x1e','\x0f','\x01',&local_32,"");
        if ((bVar1) && (local_32 == '=')) {
          busIsI2C_local[0] = true;
          busIsI2C_local[1] = false;
          busIsI2C_local[2] = false;
          busIsI2C_local[3] = false;
          *puStack_30 = 'k';
          *slaveAddress_local = '\x01';
          printf("%s","Detected LSM9DS1 at option/option 2 address\n");
          fflush(_stdout);
          return true;
        }
        bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'\x1f','\x0f','\x01',&local_32,"");
        if ((bVar1) && (local_32 == '=')) {
          busIsI2C_local[0] = true;
          busIsI2C_local[1] = false;
          busIsI2C_local[2] = false;
          busIsI2C_local[3] = false;
          *puStack_30 = 'k';
          *slaveAddress_local = '\x01';
          printf("%s","Detected LSM9DS1 at option/option 3 address\n");
          fflush(_stdout);
          return true;
        }
      }
    }
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'j','\x0f','\x01',&local_31,"");
    if ((bVar1) && (local_31 == 0xd4)) {
      busIsI2C_local[0] = true;
      busIsI2C_local[1] = false;
      busIsI2C_local[2] = false;
      busIsI2C_local[3] = false;
      *puStack_30 = 'j';
      *slaveAddress_local = '\x01';
      printf("%s","Detected L3GD20 at standard address\n");
      fflush(_stdout);
      return true;
    }
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'k','\x0f','\x01',&local_31,"");
    if ((bVar1) && (local_31 == 0xd4)) {
      busIsI2C_local[0] = true;
      busIsI2C_local[1] = false;
      busIsI2C_local[2] = false;
      busIsI2C_local[3] = false;
      *puStack_30 = 'k';
      *slaveAddress_local = '\x01';
      printf("%s","Detected L3GD20 at option address\n");
      fflush(_stdout);
      return true;
    }
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'h','\0','\x01',&local_31,"");
    if ((bVar1) && (local_31 == '\x0f')) {
      busIsI2C_local[0] = true;
      busIsI2C_local[1] = false;
      busIsI2C_local[2] = false;
      busIsI2C_local[3] = false;
      *puStack_30 = 'h';
      *slaveAddress_local = '\x01';
      printf("%s","Detected BMX055 at standard address\n");
      fflush(_stdout);
      return true;
    }
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'i','\0','\x01',&local_31,"");
    if ((bVar1) && (local_31 == '\x0f')) {
      busIsI2C_local[0] = true;
      busIsI2C_local[1] = false;
      busIsI2C_local[2] = false;
      busIsI2C_local[3] = false;
      *puStack_30 = 'i';
      *slaveAddress_local = '\x01';
      printf("%s","Detected BMX055 at option address\n");
      fflush(_stdout);
      return true;
    }
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'(','\0','\x01',&local_31,"");
    if ((bVar1) && (local_31 == 0xa0)) {
      busIsI2C_local[0] = true;
      busIsI2C_local[1] = false;
      busIsI2C_local[2] = false;
      busIsI2C_local[3] = false;
      *puStack_30 = '(';
      *slaveAddress_local = '\x01';
      printf("%s","Detected BNO055 at standard address\n");
      fflush(_stdout);
      return true;
    }
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,')','\0','\x01',&local_31,"");
    if ((bVar1) && (local_31 == 0xa0)) {
      busIsI2C_local[0] = true;
      busIsI2C_local[1] = false;
      busIsI2C_local[2] = false;
      busIsI2C_local[3] = false;
      *puStack_30 = ')';
      *slaveAddress_local = '\x01';
      printf("%s","Detected BNO055 at option address\n");
      fflush(_stdout);
      return true;
    }
    RTIMUHal::HALClose(&this->super_RTIMUHal);
  }
  (this->super_RTIMUHal).m_busIsI2C = false;
  (this->super_RTIMUHal).m_SPIBus = '\0';
  (this->super_RTIMUHal).m_SPISelect = '\0';
  bVar1 = RTIMUHal::HALOpen(&this->super_RTIMUHal);
  if (bVar1) {
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'h','u','\x01',&local_31,"");
    if ((bVar1) && (local_31 == 'q')) {
      busIsI2C_local[0] = true;
      busIsI2C_local[1] = false;
      busIsI2C_local[2] = false;
      busIsI2C_local[3] = false;
      *puStack_30 = 'h';
      *slaveAddress_local = '\0';
      printf("%s","Detected MPU9250 on SPI bus 0, select 0\n");
      fflush(_stdout);
      return true;
    }
    RTIMUHal::HALClose(&this->super_RTIMUHal);
  }
  (this->super_RTIMUHal).m_SPISelect = '\x01';
  bVar1 = RTIMUHal::HALOpen(&this->super_RTIMUHal);
  if (bVar1) {
    bVar1 = RTIMUHal::HALRead(&this->super_RTIMUHal,'h','u','\x01',&local_31,"");
    if ((bVar1) && (local_31 == 'q')) {
      busIsI2C_local[0] = true;
      busIsI2C_local[1] = false;
      busIsI2C_local[2] = false;
      busIsI2C_local[3] = false;
      *puStack_30 = 'h';
      *slaveAddress_local = '\0';
      printf("%s","Detected MPU9250 on SPI bus 0, select 1\n");
      fflush(_stdout);
      return true;
    }
    RTIMUHal::HALClose(&this->super_RTIMUHal);
  }
  fprintf(_stderr,"No IMU detected\n");
  return false;
}

Assistant:

bool RTIMUSettings::discoverIMU(int& imuType, bool& busIsI2C, unsigned char& slaveAddress)
{
    unsigned char result;
    unsigned char altResult;

    //  auto detect on I2C bus

    m_busIsI2C = true;

    if (HALOpen()) {

        if (HALRead(MPU9150_ADDRESS0, MPU9150_WHO_AM_I, 1, &result, "")) {
            if (result == MPU9250_ID) {
                imuType = RTIMU_TYPE_MPU9250;
                slaveAddress = MPU9250_ADDRESS0;
                busIsI2C = true;
                HAL_INFO("Detected MPU9250 at standard address\n");
                return true;
            } else if (result == MPU9150_ID) {
                imuType = RTIMU_TYPE_MPU9150;
                slaveAddress = MPU9150_ADDRESS0;
                busIsI2C = true;
                HAL_INFO("Detected MPU9150 at standard address\n");
                return true;
            }
        }

        if (HALRead(MPU9150_ADDRESS1, MPU9150_WHO_AM_I, 1, &result, "")) {
            if (result == MPU9250_ID) {
                imuType = RTIMU_TYPE_MPU9250;
                slaveAddress = MPU9250_ADDRESS1;
                busIsI2C = true;
                HAL_INFO("Detected MPU9250 at option address\n");
                return true;
            } else if (result == MPU9150_ID) {
                imuType = RTIMU_TYPE_MPU9150;
                slaveAddress = MPU9150_ADDRESS1;
                busIsI2C = true;
                HAL_INFO("Detected MPU9150 at option address\n");
                return true;
            }
        }

        if (HALRead(L3GD20H_ADDRESS0, L3GD20H_WHO_AM_I, 1, &result, "")) {
            if (result == L3GD20H_ID) {
                if (HALRead(LSM303D_ADDRESS0, LSM303D_WHO_AM_I, 1, &altResult, "")) {
                    if (altResult == LSM303D_ID) {
                        imuType = RTIMU_TYPE_GD20HM303D;
                        slaveAddress = L3GD20H_ADDRESS0;
                        busIsI2C = true;
                        HAL_INFO("Detected L3GD20H/LSM303D at standard/standard address\n");
                        return true;
                    }
                }
                if (HALRead(LSM303D_ADDRESS1, LSM303D_WHO_AM_I, 1, &altResult, "")) {
                    if (altResult == LSM303D_ID) {
                        imuType = RTIMU_TYPE_GD20HM303D;
                        slaveAddress = L3GD20H_ADDRESS0;
                        busIsI2C = true;
                        HAL_INFO("Detected L3GD20H/LSM303D at standard/option address\n");
                        return true;
                    }
                }
                if (HALRead(LSM303DLHC_ACCEL_ADDRESS, LSM303DLHC_STATUS_A, 1, &altResult, "")) {
                    imuType = RTIMU_TYPE_GD20HM303DLHC;
                    slaveAddress = L3GD20H_ADDRESS0;
                    busIsI2C = true;
                    HAL_INFO("Detected L3GD20H/LSM303DLHC at standard/standard address\n");
                    return true;
                }
            } else if (result == LSM9DS0_GYRO_ID) {
                if (HALRead(LSM9DS0_ACCELMAG_ADDRESS0, LSM9DS0_WHO_AM_I, 1, &altResult, "")) {
                    if (altResult == LSM9DS0_ACCELMAG_ID) {
                        imuType = RTIMU_TYPE_LSM9DS0;
                        slaveAddress = LSM9DS0_GYRO_ADDRESS0;
                        busIsI2C = true;
                        HAL_INFO("Detected LSM9DS0 at standard/standard address\n");
                        return true;
                    }
                }
                if (HALRead(LSM9DS0_ACCELMAG_ADDRESS1, LSM9DS0_WHO_AM_I, 1, &altResult, "")) {
                    if (altResult == LSM9DS0_ACCELMAG_ID) {
                        imuType = RTIMU_TYPE_LSM9DS0;
                        slaveAddress = LSM9DS0_GYRO_ADDRESS0;
                        busIsI2C = true;
                        HAL_INFO("Detected LSM9DS0 at standard/option address\n");
                        return true;
                    }
                }
            } else if (result == LSM9DS1_ID) {
                if (HALRead(LSM9DS1_MAG_ADDRESS0, LSM9DS1_MAG_WHO_AM_I, 1, &altResult, "")) {
                    if (altResult == LSM9DS1_MAG_ID) {
                        imuType = RTIMU_TYPE_LSM9DS1;
                        slaveAddress = LSM9DS1_ADDRESS0;
                        busIsI2C = true;
                        HAL_INFO("Detected LSM9DS1 at standard/standard address\n");
                        return true;
                    }
                }
                if (HALRead(LSM9DS1_MAG_ADDRESS1, LSM9DS1_MAG_WHO_AM_I, 1, &altResult, "")) {
                    if (altResult == LSM9DS1_MAG_ID) {
                        imuType = RTIMU_TYPE_LSM9DS1;
                        slaveAddress = LSM9DS1_ADDRESS0;
                        busIsI2C = true;
                        HAL_INFO("Detected LSM9DS1 at standard/option 1 address\n");
                        return true;
                    }
                }
                if (HALRead(LSM9DS1_MAG_ADDRESS2, LSM9DS1_MAG_WHO_AM_I, 1, &altResult, "")) {
                    if (altResult == LSM9DS1_MAG_ID) {
                        imuType = RTIMU_TYPE_LSM9DS1;
                        slaveAddress = LSM9DS1_ADDRESS0;
                        busIsI2C = true;
                        HAL_INFO("Detected LSM9DS1 at standard/option 2 address\n");
                        return true;
                    }
                }
                if (HALRead(LSM9DS1_MAG_ADDRESS3, LSM9DS1_MAG_WHO_AM_I, 1, &altResult, "")) {
                    if (altResult == LSM9DS1_MAG_ID) {
                        imuType = RTIMU_TYPE_LSM9DS1;
                        slaveAddress = LSM9DS1_ADDRESS0;
                        busIsI2C = true;
                        HAL_INFO("Detected LSM9DS1 at standard/option 3 address\n");
                        return true;
                    }
                }
            }
        }

        if (HALRead(L3GD20H_ADDRESS1, L3GD20H_WHO_AM_I, 1, &result, "")) {
            if (result == L3GD20H_ID) {
                if (HALRead(LSM303D_ADDRESS1, LSM303D_WHO_AM_I, 1, &altResult, "")) {
                    if (altResult == LSM303D_ID) {
                        imuType = RTIMU_TYPE_GD20HM303D;
                        slaveAddress = L3GD20H_ADDRESS1;
                        busIsI2C = true;
                        HAL_INFO("Detected L3GD20H/LSM303D at option/option address\n");
                        return true;
                    }
                }
                if (HALRead(LSM303D_ADDRESS0, LSM303D_WHO_AM_I, 1, &altResult, "")) {
                    if (altResult == LSM303D_ID) {
                        imuType = RTIMU_TYPE_GD20HM303D;
                        slaveAddress = L3GD20H_ADDRESS1;
                        busIsI2C = true;
                        HAL_INFO("Detected L3GD20H/LSM303D at option/standard address\n");
                        return true;
                    }
                }
                if (HALRead(LSM303DLHC_ACCEL_ADDRESS, LSM303DLHC_STATUS_A, 1, &altResult, "")) {
                    imuType = RTIMU_TYPE_GD20HM303DLHC;
                    slaveAddress = L3GD20H_ADDRESS1;
                    busIsI2C = true;
                    HAL_INFO("Detected L3GD20H/LSM303DLHC at option/standard address\n");
                    return true;
                }
            } else if (result == LSM9DS0_GYRO_ID) {
                if (HALRead(LSM9DS0_ACCELMAG_ADDRESS1, LSM9DS0_WHO_AM_I, 1, &altResult, "")) {
                    if (altResult == LSM9DS0_ACCELMAG_ID) {
                        imuType = RTIMU_TYPE_LSM9DS0;
                        slaveAddress = LSM9DS0_GYRO_ADDRESS1;
                        busIsI2C = true;
                        HAL_INFO("Detected LSM9DS0 at option/option address\n");
                        return true;
                    }
                }
                if (HALRead(LSM9DS0_ACCELMAG_ADDRESS0, LSM9DS0_WHO_AM_I, 1, &altResult, "")) {
                    if (altResult == LSM9DS0_ACCELMAG_ID) {
                        imuType = RTIMU_TYPE_LSM9DS0;
                        slaveAddress = LSM9DS0_GYRO_ADDRESS1;
                        busIsI2C = true;
                        HAL_INFO("Detected LSM9DS0 at option/standard address\n");
                        return true;
                    }
                }
            } else if (result == LSM9DS1_ID) {
                if (HALRead(LSM9DS1_MAG_ADDRESS0, LSM9DS1_MAG_WHO_AM_I, 1, &altResult, "")) {
                    if (altResult == LSM9DS1_MAG_ID) {
                        imuType = RTIMU_TYPE_LSM9DS1;
                        slaveAddress = LSM9DS1_ADDRESS1;
                        busIsI2C = true;
                        HAL_INFO("Detected LSM9DS1 at option/standard address\n");
                        return true;
                    }
                }
                if (HALRead(LSM9DS1_MAG_ADDRESS1, LSM9DS1_MAG_WHO_AM_I, 1, &altResult, "")) {
                    if (altResult == LSM9DS1_MAG_ID) {
                        imuType = RTIMU_TYPE_LSM9DS1;
                        slaveAddress = LSM9DS1_ADDRESS1;
                        busIsI2C = true;
                        HAL_INFO("Detected LSM9DS1 at option/option 1 address\n");
                        return true;
                    }
                }
                if (HALRead(LSM9DS1_MAG_ADDRESS2, LSM9DS1_MAG_WHO_AM_I, 1, &altResult, "")) {
                    if (altResult == LSM9DS1_MAG_ID) {
                        imuType = RTIMU_TYPE_LSM9DS1;
                        slaveAddress = LSM9DS1_ADDRESS1;
                        busIsI2C = true;
                        HAL_INFO("Detected LSM9DS1 at option/option 2 address\n");
                        return true;
                    }
                }
                if (HALRead(LSM9DS1_MAG_ADDRESS3, LSM9DS1_MAG_WHO_AM_I, 1, &altResult, "")) {
                    if (altResult == LSM9DS1_MAG_ID) {
                        imuType = RTIMU_TYPE_LSM9DS1;
                        slaveAddress = LSM9DS1_ADDRESS1;
                        busIsI2C = true;
                        HAL_INFO("Detected LSM9DS1 at option/option 3 address\n");
                        return true;
                    }
                }
            }
        }

        if (HALRead(L3GD20_ADDRESS0, L3GD20_WHO_AM_I, 1, &result, "")) {
            if (result == L3GD20_ID) {
                imuType = RTIMU_TYPE_GD20M303DLHC;
                slaveAddress = L3GD20_ADDRESS0;
                busIsI2C = true;
                HAL_INFO("Detected L3GD20 at standard address\n");
                return true;
            }
        }

        if (HALRead(L3GD20_ADDRESS1, L3GD20_WHO_AM_I, 1, &result, "")) {
            if (result == L3GD20_ID) {
                imuType = RTIMU_TYPE_GD20M303DLHC;
                slaveAddress = L3GD20_ADDRESS1;
                busIsI2C = true;
                HAL_INFO("Detected L3GD20 at option address\n");
                return true;
            }
        }

        if (HALRead(BMX055_GYRO_ADDRESS0, BMX055_GYRO_WHO_AM_I, 1, &result, "")) {
            if (result == BMX055_GYRO_ID) {
                imuType = RTIMU_TYPE_BMX055;
                slaveAddress = BMX055_GYRO_ADDRESS0;
                busIsI2C = true;
                HAL_INFO("Detected BMX055 at standard address\n");
                return true;
            }
        }
        if (HALRead(BMX055_GYRO_ADDRESS1, BMX055_GYRO_WHO_AM_I, 1, &result, "")) {
            if (result == BMX055_GYRO_ID) {
                imuType = RTIMU_TYPE_BMX055;
                slaveAddress = BMX055_GYRO_ADDRESS1;
                busIsI2C = true;
                HAL_INFO("Detected BMX055 at option address\n");
                return true;
            }
        }

        if (HALRead(BNO055_ADDRESS0, BNO055_WHO_AM_I, 1, &result, "")) {
            if (result == BNO055_ID) {
                imuType = RTIMU_TYPE_BNO055;
                slaveAddress = BNO055_ADDRESS0;
                busIsI2C = true;
                HAL_INFO("Detected BNO055 at standard address\n");
                return true;
            }
        }
        if (HALRead(BNO055_ADDRESS1, BNO055_WHO_AM_I, 1, &result, "")) {
            if (result == BNO055_ID) {
                imuType = RTIMU_TYPE_BNO055;
                slaveAddress = BNO055_ADDRESS1;
                busIsI2C = true;
                HAL_INFO("Detected BNO055 at option address\n");
                return true;
            }
        }
        HALClose();
    }

    //  nothing found on I2C bus - try SPI instead

    m_busIsI2C = false;
    m_SPIBus = 0;

    m_SPISelect = 0;

    if (HALOpen()) {
        if (HALRead(MPU9250_ADDRESS0, MPU9250_WHO_AM_I, 1, &result, "")) {
            if (result == MPU9250_ID) {
                imuType = RTIMU_TYPE_MPU9250;
                slaveAddress = MPU9250_ADDRESS0;
                busIsI2C = false;
                HAL_INFO("Detected MPU9250 on SPI bus 0, select 0\n");
                return true;
            }
        }
        HALClose();
    }

    m_SPISelect = 1;

    if (HALOpen()) {
        if (HALRead(MPU9250_ADDRESS0, MPU9250_WHO_AM_I, 1, &result, "")) {
            if (result == MPU9250_ID) {
                imuType = RTIMU_TYPE_MPU9250;
                slaveAddress = MPU9250_ADDRESS0;
                busIsI2C = false;
                HAL_INFO("Detected MPU9250 on SPI bus 0, select 1\n");
                return true;
            }
        }
        HALClose();
    }

    HAL_ERROR("No IMU detected\n");
    return false;
}